

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

string * FIX::file_appendpath(string *__return_storage_ptr__,string *path,string *file)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  undefined2 *local_48;
  undefined8 local_40;
  undefined2 local_38;
  undefined6 uStack_36;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  if ((pcVar1[path->_M_string_length - 1] == '\\') || (pcVar1[path->_M_string_length - 1] == '/')) {
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + path->_M_string_length);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)(file->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_58[0] = local_78;
    puVar7 = local_88;
    if (local_88 == &local_78) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + path->_M_string_length);
    local_38 = 0x2f;
    local_40 = 1;
    uVar6 = 0xf;
    if (local_68 != local_58) {
      uVar6 = local_58[0];
    }
    local_48 = &local_38;
    if ((local_60 + 1U < 0x10) && (uVar6 < local_60 + 1U)) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
    }
    else {
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)&local_38);
    }
    local_88 = &local_78;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_78 = *puVar7;
      uStack_70 = puVar4[3];
    }
    else {
      local_78 = *puVar7;
      local_88 = (ulong *)*puVar4;
    }
    local_80 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)(file->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT62(uStack_36,local_38) + 1);
    }
    puVar7 = local_68;
    if (local_68 == local_58) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(puVar7,local_58[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string file_appendpath(const std::string &path, const std::string &file) {
  const char last = path[path.size() - 1];
  if (last == '/' || last == '\\') {
    return std::string(path) + file;
  } else {
    return std::string(path) + file_separator() + file;
  }
}